

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_135f2b2::ObmcSadTest_RandomValues_Test::TestBody
          (ObmcSadTest_RandomValues_Test *this)

{
  bool bVar1;
  uint8_t uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  char *in_RDI;
  AssertionResult gtest_ar;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  uint tst_res;
  uint ref_res;
  int i;
  int pre_stride;
  int iter;
  int32_t mask [16384];
  int32_t wsrc [16384];
  uint8_t pre [16384];
  int in_stack_fffffffffffdbf24;
  AssertHelper *in_stack_fffffffffffdbf28;
  AssertionResult *this_00;
  undefined4 in_stack_fffffffffffdbf38;
  uint in_stack_fffffffffffdbf40;
  uint in_stack_fffffffffffdbf44;
  Type in_stack_fffffffffffdbf54;
  uint uVar7;
  AssertHelper *in_stack_fffffffffffdbf58;
  AssertionResult aAStack_24098 [2];
  undefined1 auStack_24072 [18];
  Message *in_stack_fffffffffffdbfa0;
  undefined4 in_stack_fffffffffffdbfa8;
  undefined4 uVar8;
  int iStack_2404c;
  int iStack_24044;
  int aiStack_24040 [16384];
  int aiStack_14040 [16384];
  uint8_t local_4040 [16440];
  
  iStack_24044 = 0;
  while( true ) {
    in_stack_fffffffffffdbf44 = in_stack_fffffffffffdbf44 & 0xffffff;
    if (iStack_24044 < 1000) {
      bVar1 = testing::Test::HasFatalFailure();
      in_stack_fffffffffffdbf44 = CONCAT13(bVar1,(int3)in_stack_fffffffffffdbf44) ^ 0xff000000;
    }
    if ((in_stack_fffffffffffdbf44 & 0x1000000) == 0) {
      return;
    }
    iVar4 = libaom_test::ACMRandom::operator()
                      ((ACMRandom *)in_stack_fffffffffffdbf28,in_stack_fffffffffffdbf24);
    for (iStack_2404c = 0; iStack_2404c < 0x4000; iStack_2404c = iStack_2404c + 1) {
      uVar2 = libaom_test::ACMRandom::Rand8((ACMRandom *)in_stack_fffffffffffdbf28);
      local_4040[iStack_2404c] = uVar2;
      bVar3 = libaom_test::ACMRandom::Rand8((ACMRandom *)in_stack_fffffffffffdbf28);
      in_stack_fffffffffffdbf40 = (uint)bVar3;
      iVar5 = libaom_test::ACMRandom::operator()
                        ((ACMRandom *)in_stack_fffffffffffdbf28,in_stack_fffffffffffdbf24);
      aiStack_14040[iStack_2404c] = in_stack_fffffffffffdbf40 * iVar5;
      iVar5 = libaom_test::ACMRandom::operator()
                        ((ACMRandom *)in_stack_fffffffffffdbf28,in_stack_fffffffffffdbf24);
      aiStack_24040[iStack_2404c] = iVar5;
    }
    (**(code **)(in_RDI + 0x20))(local_4040,iVar4,aiStack_14040,aiStack_24040);
    libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX
              ((RegisterStateCheckMMX *)&aAStack_24098[2].field_0x6);
    uVar6 = (**(code **)(in_RDI + 0x28))(local_4040,iVar4,aiStack_14040,aiStack_24040);
    uVar8 = uVar6;
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0xbd1947);
    this_00 = aAStack_24098;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffdbf44,in_stack_fffffffffffdbf40),
               (char *)CONCAT44(uVar6,in_stack_fffffffffffdbf38),(uint *)this_00,
               (uint *)in_stack_fffffffffffdbf28);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
    in_stack_fffffffffffdbf38 = CONCAT13(bVar1,(int3)in_stack_fffffffffffdbf38);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffdbf58);
      in_stack_fffffffffffdbf28 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xbd19d9);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffdbf58,in_stack_fffffffffffdbf54,in_RDI,
                 in_stack_fffffffffffdbf44,(char *)CONCAT44(uVar6,in_stack_fffffffffffdbf38));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(uVar8,in_stack_fffffffffffdbfa8),in_stack_fffffffffffdbfa0
                );
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffdbf28);
      testing::Message::~Message((Message *)0xbd1a27);
    }
    uVar7 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd1a77);
    if (uVar7 != 0) break;
    iStack_24044 = iStack_24044 + 1;
    in_stack_fffffffffffdbf54 = kSuccess;
  }
  return;
}

Assistant:

TEST_P(ObmcSadTest, RandomValues) {
  DECLARE_ALIGNED(32, uint8_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  for (int iter = 0; iter < kIterations && !HasFatalFailure(); ++iter) {
    const int pre_stride = rng_(MAX_SB_SIZE + 1);

    for (int i = 0; i < MAX_SB_SQUARE; ++i) {
      pre[i] = rng_.Rand8();
      wsrc[i] = rng_.Rand8() * rng_(kMaskMax * kMaskMax + 1);
      mask[i] = rng_(kMaskMax * kMaskMax + 1);
    }

    const unsigned int ref_res = params_.ref_func(pre, pre_stride, wsrc, mask);
    unsigned int tst_res;
    API_REGISTER_STATE_CHECK(tst_res =
                                 params_.tst_func(pre, pre_stride, wsrc, mask));

    ASSERT_EQ(ref_res, tst_res);
  }
}